

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcHashEntryPpDefine::CTcHashEntryPpDefine
          (CTcHashEntryPpDefine *this,textchar_t *str,size_t len,int copy,int has_args,int argc,
          int has_varargs,char **argv,size_t *argvlen,char *expansion,size_t expan_len)

{
  char ***pppcVar1;
  byte bVar2;
  char **ppcVar3;
  CVmHashTable *this_00;
  undefined8 *puVar4;
  CTcHashEntryPpArg **ppCVar5;
  char *pcVar6;
  CVmHashEntry *this_01;
  ulong uVar7;
  
  CVmHashEntry::CVmHashEntry((CVmHashEntry *)this,str,len,copy);
  bVar2 = (this->super_CTcHashEntryPp).field_0x44;
  pppcVar1 = &(this->super_CTcHashEntryPp).argv_;
  (this->super_CTcHashEntryPp).argv_ = (char **)0x0;
  (this->super_CTcHashEntryPp).params_table_ = (CVmHashTable *)0x0;
  (this->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CTcHashEntryPpDefine_00324890;
  (this->super_CTcHashEntryPp).field_0x44 =
       (char)has_varargs * '\x02' & 2U | (byte)has_args & 1 | bVar2 & 0xfc;
  (this->super_CTcHashEntryPp).argc_ = argc;
  if (argc == 0) {
    *pppcVar1 = (char **)0x0;
    (this->super_CTcHashEntryPp).arg_entry_ = (CTcHashEntryPpArg **)0x0;
    (this->super_CTcHashEntryPp).params_table_ = (CVmHashTable *)0x0;
  }
  else {
    ppcVar3 = (char **)malloc((long)argc << 3);
    *pppcVar1 = ppcVar3;
    this_00 = (CVmHashTable *)operator_new(0x20);
    puVar4 = (undefined8 *)operator_new(8);
    *puVar4 = &PTR__CVmHashFunc_0032a8a8;
    CVmHashTable::init(this_00,(EVP_PKEY_CTX *)0x10);
    (this->super_CTcHashEntryPp).params_table_ = this_00;
    ppCVar5 = (CTcHashEntryPpArg **)malloc((long)argc << 3);
    (this->super_CTcHashEntryPp).arg_entry_ = ppCVar5;
    if (0 < argc) {
      uVar7 = 0;
      do {
        pcVar6 = lib_copy_str(argv[uVar7],argvlen[uVar7]);
        (*pppcVar1)[uVar7] = pcVar6;
        this_01 = (CVmHashEntry *)operator_new(0x28);
        CVmHashEntry::CVmHashEntry(this_01,(*pppcVar1)[uVar7],argvlen[uVar7],0);
        this_01->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00324c78;
        *(int *)&this_01->field_0x24 = (int)uVar7;
        CVmHashTable::add((this->super_CTcHashEntryPp).params_table_,this_01);
        (this->super_CTcHashEntryPp).arg_entry_[uVar7] = (CTcHashEntryPpArg *)this_01;
        uVar7 = uVar7 + 1;
      } while ((uint)argc != uVar7);
    }
  }
  pcVar6 = lib_copy_str(expansion,expan_len);
  this->orig_expan_ = pcVar6;
  this->orig_expan_len_ = expan_len;
  parse_expansion(this,argvlen);
  return;
}

Assistant:

CTcHashEntryPpDefine::CTcHashEntryPpDefine(const textchar_t *str, size_t len,
                                           int copy, int has_args, int argc,
                                           int has_varargs,
                                           const char **argv,
                                           const size_t *argvlen,
                                           const char *expansion,
                                           size_t expan_len)
    : CTcHashEntryPp(str, len, copy)
{
    /* copy the argument list if necessary */
    has_args_ = has_args;
    has_varargs_ = has_varargs;
    argc_ = argc;
    if (argc != 0)
    {
        int i;
        
        /* allocate the argument list */
        argv_ = (char **)t3malloc(argc * sizeof(*argv_));

        /* allocate the parameters hash table */
        params_table_ = new CVmHashTable(16, new CVmHashFuncCS(), TRUE);

        /* allocate the entry list */
        arg_entry_ = (CTcHashEntryPpArg **)
                     t3malloc(argc * sizeof(arg_entry_[0]));

        /* copy the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            CTcHashEntryPpArg *entry;
            
            /* copy the argument name */
            argv_[i] = lib_copy_str(argv[i], argvlen[i]);

            /* 
             *   Create the hash entries for this parameters.  We'll use
             *   this entry to look up tokens in the expansion text for
             *   matches to the formal names when expanding the macro.
             *   
             *   Note that we'll refer directly to our local copy of the
             *   argument name, so we don't need to make another copy in
             *   the hash entry.  
             */
            entry = new CTcHashEntryPpArg(argv_[i], argvlen[i], FALSE, i);
            params_table_->add(entry);

            /* add it to our by-index list */
            arg_entry_[i] = entry;
        }
    }
    else
    {
        /* no arguments */
        argv_ = 0;
        params_table_ = 0;
        arg_entry_ = 0;
    }

    /* save the original version of the expansion */
    orig_expan_ = lib_copy_str(expansion, expan_len);
    orig_expan_len_ = expan_len;

    /* parse the expansion, and save the parsed result */
    parse_expansion(argvlen);
}